

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::CoverpointSymbol::checkBins(CoverpointSymbol *this)

{
  string_view arg;
  bool bVar1;
  LanguageVersion LVar2;
  Diagnostic *this_00;
  Symbol *in_RDI;
  char *unaff_retaddr;
  Scope *scope;
  SourceLocation in_stack_00000058;
  DiagCode in_stack_00000064;
  Scope *in_stack_ffffffffffffffc0;
  Symbol *pSVar3;
  
  pSVar3 = in_RDI;
  getType((CoverpointSymbol *)0x6d4927);
  bVar1 = Type::isFloating((Type *)0x6d492f);
  if (bVar1) {
    this_00 = (Diagnostic *)Symbol::getParentScope(in_RDI);
    if ((((ulong)in_RDI[3].location & 1) == 0) ||
       (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&in_RDI->name), bVar1))
    {
      Scope::membersOfType<slang::ast::CoverageBinSymbol>(in_stack_ffffffffffffffc0);
      bVar1 = std::ranges::
              subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_(std::ranges::subrange_kind)0>
              ::empty((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::CoverageBinSymbol>,_(std::ranges::subrange_kind)0>
                       *)0x6d49db);
      if (bVar1) {
        Scope::getCompilation((Scope *)this_00);
        LVar2 = Compilation::languageVersion((Compilation *)0x6d49f3);
        if (0 < (int)LVar2) {
          Scope::addDiag((Scope *)this,in_stack_00000064,in_stack_00000058);
        }
      }
    }
    else {
      Scope::addDiag((Scope *)this,in_stack_00000064,in_stack_00000058);
      arg._M_str = unaff_retaddr;
      arg._M_len = (size_t)pSVar3;
      Diagnostic::operator<<(this_00,arg);
    }
  }
  return;
}

Assistant:

void CoverpointSymbol::checkBins() const {
    if (getType().isFloating()) {
        auto scope = getParentScope();
        SLANG_ASSERT(scope);

        if (isImplicit && !name.empty()) {
            scope->addDiag(diag::RealCoverpointImplicit, location) << name;
        }
        else if (membersOfType<CoverageBinSymbol>().empty()) {
            if (scope->getCompilation().languageVersion() >= LanguageVersion::v1800_2023)
                scope->addDiag(diag::RealCoverpointBins, location);
        }
    }
}